

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

wchar_t parse_cmd(EditLine *el,wchar_t *cmd)

{
  int iVar1;
  wchar_t *pwVar2;
  size_t sVar3;
  
  sVar3 = (el->el_map).nfunc;
  if (sVar3 != 0) {
    pwVar2 = &((el->el_map).help)->func;
    do {
      iVar1 = wcscmp(((el_bindings_t *)(pwVar2 + -2))->name,cmd);
      if (iVar1 == 0) {
        return *pwVar2;
      }
      pwVar2 = pwVar2 + 6;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
  }
  return L'\xffffffff';
}

Assistant:

libedit_private int
parse_cmd(EditLine *el, const wchar_t *cmd)
{
	el_bindings_t *b = el->el_map.help;
	size_t i;

	for (i = 0; i < el->el_map.nfunc; i++)
		if (wcscmp(b[i].name, cmd) == 0)
			return b[i].func;
	return -1;
}